

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

QString * __thiscall QtPrivate::QCalendarYearValidator::text(QCalendarYearValidator *this)

{
  long lVar1;
  undefined8 in_RSI;
  int pos;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *str;
  
  pos = (int)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str = in_RDI;
  formatNumber((int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  QCalendarDateSectionValidator::highlightString(str,pos);
  QString::~QString((QString *)0x516bbf);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QCalendarYearValidator::text() const
{
    return highlightString(formatNumber(m_year, 4), m_pos);
}